

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O3

REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity,REF_BOOL *allowed)

{
  REF_DBL *pRVar1;
  int node0;
  REF_GRID pRVar2;
  REF_NODE ref_node;
  REF_ADAPT pRVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  REF_DBL ratio;
  double local_38;
  
  pRVar2 = ref_cavity->ref_grid;
  ref_node = pRVar2->node;
  node0 = ref_cavity->node;
  *allowed = 1;
  iVar5 = ref_cavity->maxface;
  if (0 < iVar5) {
    lVar9 = 0;
    lVar8 = 0;
    do {
      if (ref_cavity->f2n[lVar8 * 3] != -1) {
        lVar7 = 0;
        bVar4 = false;
        do {
          if (node0 == *(int *)((long)ref_cavity->f2n + lVar7 * 4 + lVar9)) {
            bVar4 = true;
          }
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (!bVar4) {
          lVar7 = 0;
          do {
            uVar6 = ref_node_ratio(ref_node,node0,
                                   *(REF_INT *)((long)ref_cavity->f2n + lVar7 * 4 + lVar9),&local_38
                                  );
            if (uVar6 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x920,"ref_cavity_ratio",(ulong)uVar6,"ratio");
              return uVar6;
            }
            pRVar3 = pRVar2->adapt;
            if ((local_38 < pRVar3->post_min_ratio) ||
               (pRVar1 = &pRVar3->post_max_ratio, *pRVar1 <= local_38 && local_38 != *pRVar1)) {
              *allowed = 0;
              return 0;
            }
            lVar7 = lVar7 + 1;
          } while (lVar7 != 3);
          iVar5 = ref_cavity->maxface;
        }
      }
      lVar8 = lVar8 + 1;
      lVar9 = lVar9 + 0xc;
    } while (lVar8 < iVar5);
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_ratio(REF_CAVITY ref_cavity, REF_BOOL *allowed) {
  REF_GRID ref_grid = ref_cavity_grid(ref_cavity);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT node = ref_cavity_node(ref_cavity);
  REF_DBL ratio;
  REF_INT face, face_node;
  REF_BOOL skip;

  *allowed = REF_TRUE;

  each_ref_cavity_valid_face(ref_cavity, face) {
    skip = REF_FALSE;
    /* skip a collapsed triangle that in on the boundary of cavity */
    each_ref_cavity_face_node(ref_cavity, face_node) {
      if (node == ref_cavity_f2n(ref_cavity, face_node, face)) {
        skip = REF_TRUE;
      }
    }
    if (skip) continue;
    each_ref_cavity_face_node(ref_cavity, face_node) {
      RSS(ref_node_ratio(ref_node, node,
                         ref_cavity_f2n(ref_cavity, face_node, face), &ratio),
          "ratio");
      if (ratio < ref_grid_adapt(ref_grid, post_min_ratio) ||
          ratio > ref_grid_adapt(ref_grid, post_max_ratio)) {
        *allowed = REF_FALSE;
        return REF_SUCCESS;
      }
    }
  }

  return REF_SUCCESS;
}